

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

string * __thiscall
zmq::socket_base_t::resolve_tcp_addr
          (string *__return_storage_ptr__,socket_base_t *this,string *endpoint_uri_pair_,
          char *tcp_address_)

{
  int iVar1;
  iterator iVar2;
  tcp_address_t *this_00;
  iterator iVar3;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
          ::find(&(this->_endpoints)._M_t,endpoint_uri_pair_);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->_endpoints)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
    if (this_00 == (tcp_address_t *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
              ,0x46a);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
    }
    else {
      tcp_address_t::tcp_address_t(this_00);
    }
    iVar1 = tcp_address_t::resolve(this_00,tcp_address_,false,(this->super_own_t).options.ipv6);
    if (iVar1 == 0) {
      tcp_address_t::to_string(this_00,endpoint_uri_pair_);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
              ::find(&(this->_endpoints)._M_t,endpoint_uri_pair_);
      if (iVar3._M_node == iVar2._M_node) {
        iVar1 = tcp_address_t::resolve(this_00,tcp_address_,true,(this->super_own_t).options.ipv6);
        if (iVar1 == 0) {
          tcp_address_t::to_string(this_00,endpoint_uri_pair_);
        }
      }
    }
    operator_delete(this_00,0x3c);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)endpoint_uri_pair_);
  return __return_storage_ptr__;
}

Assistant:

std::string
zmq::socket_base_t::resolve_tcp_addr (std::string endpoint_uri_pair_,
                                      const char *tcp_address_)
{
    // The resolved last_endpoint is used as a key in the endpoints map.
    // The address passed by the user might not match in the TCP case due to
    // IPv4-in-IPv6 mapping (EG: tcp://[::ffff:127.0.0.1]:9999), so try to
    // resolve before giving up. Given at this stage we don't know whether a
    // socket is connected or bound, try with both.
    if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
        tcp_address_t *tcp_addr = new (std::nothrow) tcp_address_t ();
        alloc_assert (tcp_addr);
        int rc = tcp_addr->resolve (tcp_address_, false, options.ipv6);

        if (rc == 0) {
            tcp_addr->to_string (endpoint_uri_pair_);
            if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
                rc = tcp_addr->resolve (tcp_address_, true, options.ipv6);
                if (rc == 0) {
                    tcp_addr->to_string (endpoint_uri_pair_);
                }
            }
        }
        LIBZMQ_DELETE (tcp_addr);
    }
    return endpoint_uri_pair_;
}